

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineReader.cpp
# Opt level: O1

map<unsigned_long,_std::vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>_>_>_>
* __thiscall
adios2::core::engine::InlineReader::DoAllStepsBlocksInfo
          (map<unsigned_long,_std::vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>_>_>_>
           *__return_storage_ptr__,InlineReader *this,Variable<signed_char> *variable)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  ScopedTimer __var2196;
  ScopedTimer local_10;
  
  if (DoAllStepsBlocksInfo(adios2::core::Variable<signed>const&)::__var196 == '\0') {
    iVar2 = __cxa_guard_acquire(&DoAllStepsBlocksInfo(adios2::core::Variable<signed>const&)::
                                 __var196);
    if (iVar2 != 0) {
      DoAllStepsBlocksInfo::__var196 = (void *)ps_timer_create_("InlineReader::AllStepsBlockInfo");
      __cxa_guard_release(&DoAllStepsBlocksInfo(adios2::core::Variable<signed>const&)::__var196);
    }
  }
  local_10.m_timer = DoAllStepsBlocksInfo::__var196;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_10);
  return __return_storage_ptr__;
}

Assistant:

void InlineReader::Init()
{
    InitParameters();
    InitTransports();
}